

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_helper.hpp
# Opt level: O2

void __thiscall TempFile::TempFile(TempFile *this,string *name)

{
  runtime_error *this_00;
  string sStack_38;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  CLI::NonexistentPath(&sStack_38,&this->_name);
  std::__cxx11::string::~string((string *)&sStack_38);
  if (sStack_38._M_string_length == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)this);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TempFile(std::string name) : _name(name) {
        if(!CLI::NonexistentPath(_name).empty())
            throw std::runtime_error(_name);
    }